

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

int __thiscall
FIX::Session::verify
          (Session *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  int iVar2;
  FieldMap *this_00;
  FieldBase *msgType;
  FieldBase *senderCompID_00;
  FieldBase *targetCompID_00;
  logic_error *this_01;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long lVar3;
  long extraout_RAX_02;
  signed_int value;
  signed_int value_00;
  MsgType local_1d8;
  undefined1 local_178 [8];
  UtcTimeStamp now;
  exception *e;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ResendRange local_70;
  ResendRange range;
  SendingTime *sendingTime;
  TargetCompID *targetCompID;
  SenderCompID *senderCompID;
  Header *header;
  MsgSeqNum *pMsgSeqNum;
  MsgType *pMsgType;
  bool checkTooLow_local;
  bool checkTooHigh_local;
  Message *msg_local;
  Session *this_local;
  uint7 extraout_var;
  
  header = (Header *)0x0;
  this_00 = &Message::getHeader((Message *)ctx)->super_FieldMap;
  msgType = FieldMap::getFieldPtr(this_00,0x23);
  senderCompID_00 = FieldMap::getFieldRef(this_00,0x31);
  targetCompID_00 = FieldMap::getFieldRef(this_00,0x38);
  range = (ResendRange)FieldMap::getFieldRef(this_00,0x34);
  if ((((ulong)sig & 1) != 0) || ((siglen & 1) != 0)) {
    header = (Header *)FieldMap::getFieldPtr(this_00,0x22);
  }
  bVar1 = validLogonState(this,(MsgType *)msgType);
  if (bVar1) {
    bVar1 = isGoodTime(this,(SendingTime *)range);
    if (bVar1) {
      bVar1 = isCorrectCompID(this,(SenderCompID *)senderCompID_00,(TargetCompID *)targetCompID_00);
      if (bVar1) {
        if ((((ulong)sig & 1) == 0) || (bVar1 = isTargetTooHigh(this,(MsgSeqNum *)header), !bVar1))
        {
          if (((siglen & 1) == 0) || (bVar1 = isTargetTooLow(this,(MsgSeqNum *)header), !bVar1)) {
            if (((((ulong)sig & 1) != 0) || ((siglen & 1) != 0)) &&
               (bVar1 = SessionState::resendRequested(&this->m_state), bVar1)) {
              local_70 = SessionState::resendRange(&this->m_state);
              iVar2 = IntField::operator_cast_to_int((IntField *)header);
              if (local_70.second <= iVar2) {
                IntConvertor::convert_abi_cxx11_
                          (&local_110,(IntConvertor *)((ulong)local_70 & 0xffffffff),value);
                std::operator+(&local_f0,"ResendRequest for messages FROM: ",&local_110);
                std::operator+(&local_d0,&local_f0," TO: ");
                IntConvertor::convert_abi_cxx11_
                          ((string *)&e,(IntConvertor *)((ulong)local_70 >> 0x20),value_00);
                std::operator+(&local_b0,&local_d0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &e);
                std::operator+(&local_90,&local_b0," has been satisfied.");
                SessionState::onEvent(&this->m_state,&local_90);
                std::__cxx11::string::~string((string *)&local_90);
                std::__cxx11::string::~string((string *)&local_b0);
                std::__cxx11::string::~string((string *)&e);
                std::__cxx11::string::~string((string *)&local_d0);
                std::__cxx11::string::~string((string *)&local_f0);
                std::__cxx11::string::~string((string *)&local_110);
                SessionState::resendRange(&this->m_state,0,0);
              }
            }
            UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_178);
            SessionState::lastReceivedTime(&this->m_state,(UtcTimeStamp *)local_178);
            SessionState::testRequest(&this->m_state,0);
            if (msgType == (FieldBase *)0x0) {
              MsgType::MsgType(&local_1d8);
            }
            else {
              MsgType::MsgType(&local_1d8,(MsgType *)msgType);
            }
            fromCallback(this,&local_1d8,(Message *)ctx,&this->m_sessionID);
            MsgType::~MsgType(&local_1d8);
            this_local._7_1_ = 1;
            UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_178);
            lVar3 = extraout_RAX_02;
          }
          else {
            doTargetTooLow(this,(Message *)ctx);
            lVar3 = (ulong)extraout_var << 8;
            this_local._7_1_ = 0;
          }
        }
        else {
          doTargetTooHigh(this,(Message *)ctx);
          this_local._7_1_ = 0;
          lVar3 = extraout_RAX_01;
        }
      }
      else {
        doBadCompID(this,(Message *)ctx);
        this_local._7_1_ = 0;
        lVar3 = extraout_RAX_00;
      }
    }
    else {
      doBadTime(this,(Message *)ctx);
      this_local._7_1_ = 0;
      lVar3 = extraout_RAX;
    }
    return (int)CONCAT71((int7)((ulong)lVar3 >> 8),this_local._7_1_);
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"Logon state is not valid for message");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool Session::verify( const Message& msg, bool checkTooHigh,
                      bool checkTooLow )
{
  const MsgType* pMsgType = 0;
  const MsgSeqNum* pMsgSeqNum = 0;

  try
  {
    const Header& header = msg.getHeader();

    pMsgType = FIELD_GET_PTR( header, MsgType );
    const SenderCompID& senderCompID = FIELD_GET_REF( header, SenderCompID );
    const TargetCompID& targetCompID = FIELD_GET_REF( header, TargetCompID );
    const SendingTime& sendingTime = FIELD_GET_REF( header, SendingTime );

    if( checkTooHigh || checkTooLow )
      pMsgSeqNum = FIELD_GET_PTR( header, MsgSeqNum );

    if ( !validLogonState( *pMsgType ) )
      throw std::logic_error( "Logon state is not valid for message" );

    if ( !isGoodTime( sendingTime ) )
    {
      doBadTime( msg );
      return false;
    }
    if ( !isCorrectCompID( senderCompID, targetCompID ) )
    {
      doBadCompID( msg );
      return false;
    }

    if ( checkTooHigh && isTargetTooHigh( *pMsgSeqNum ) )
    {
      doTargetTooHigh( msg );
      return false;
    }
    else if ( checkTooLow && isTargetTooLow( *pMsgSeqNum ) )
    {
      doTargetTooLow( msg );
      return false;
    }

    if ( (checkTooHigh || checkTooLow) && m_state.resendRequested() )
    {
      SessionState::ResendRange range = m_state.resendRange();
 
      if ( *pMsgSeqNum >= range.second )
      {
        m_state.onEvent ("ResendRequest for messages FROM: " +
                         IntConvertor::convert (range.first) + " TO: " +
                         IntConvertor::convert (range.second) +
                         " has been satisfied.");
        m_state.resendRange (0, 0);
      }
    }
  }
  catch ( std::exception& e )
  {
    m_state.onEvent( e.what() );
    disconnect();
    return false;
  }

  UtcTimeStamp now;
  m_state.lastReceivedTime( now );
  m_state.testRequest( 0 );

  fromCallback( pMsgType ? *pMsgType : MsgType(), msg, m_sessionID );
  return true;
}